

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

char * make_D3D_destarg_string(Context *ctx,char *buf,size_t buflen)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char local_d8 [8];
  char pred [32];
  char *pred_right;
  char *pred_left;
  ulong uStack_a0;
  int scalar;
  size_t i;
  char *pcStack_90;
  char writemask_str [6];
  char *regtype_str;
  char regnum_str [16];
  char *cent_str;
  char *pp_str;
  char *sat_str;
  char *result_shift_str;
  DestArgInfo *arg;
  size_t buflen_local;
  char *buf_local;
  Context *ctx_local;
  
  sat_str = "";
  switch((ctx->dest_arg).result_shift) {
  case 1:
    sat_str = "_x2";
    break;
  case 2:
    sat_str = "_x4";
    break;
  case 3:
    sat_str = "_x8";
    break;
  case 0xd:
    sat_str = "_d8";
    break;
  case 0xe:
    sat_str = "_d4";
    break;
  case 0xf:
    sat_str = "_d2";
  }
  pcVar2 = "";
  if (((ctx->dest_arg).result_mod & 1U) != 0) {
    pcVar2 = "_sat";
  }
  pcVar3 = "";
  if (((ctx->dest_arg).result_mod & 2U) != 0) {
    pcVar3 = "_pp";
  }
  pcVar4 = "";
  if (((ctx->dest_arg).result_mod & 4U) != 0) {
    pcVar4 = "_centroid";
  }
  pcStack_90 = get_D3D_register_string
                         (ctx,(ctx->dest_arg).regtype,(ctx->dest_arg).regnum,(char *)&regtype_str,
                          0x10);
  if (pcStack_90 == (char *)0x0) {
    fail(ctx,"Unknown destination register type.");
    *buf = '\0';
  }
  else {
    uStack_a0 = 0;
    iVar1 = isscalar(ctx,ctx->shader_type,(ctx->dest_arg).regtype,(ctx->dest_arg).regnum);
    if ((iVar1 == 0) && (iVar1 = writemask_xyzw((ctx->dest_arg).writemask), iVar1 == 0)) {
      uStack_a0 = 1;
      i._2_1_ = 0x2e;
      if ((ctx->dest_arg).writemask0 != 0) {
        uStack_a0 = 2;
        i._3_1_ = 0x78;
      }
      if ((ctx->dest_arg).writemask1 != 0) {
        *(undefined1 *)((long)&i + uStack_a0 + 2) = 0x79;
        uStack_a0 = uStack_a0 + 1;
      }
      if ((ctx->dest_arg).writemask2 != 0) {
        *(undefined1 *)((long)&i + uStack_a0 + 2) = 0x7a;
        uStack_a0 = uStack_a0 + 1;
      }
      if ((ctx->dest_arg).writemask3 != 0) {
        *(undefined1 *)((long)&i + uStack_a0 + 2) = 0x77;
        uStack_a0 = uStack_a0 + 1;
      }
    }
    *(undefined1 *)((long)&i + uStack_a0 + 2) = 0;
    if (5 < uStack_a0) {
      __assert_fail("i < sizeof (writemask_str)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x43a,"const char *make_D3D_destarg_string(Context *, char *, const size_t)");
    }
    pred_right = "";
    pred._24_8_ = (long)"\n\nUSAGE: %s <profile> [dir1] ... [dirN]\n\n" + 0x29;
    memset(local_d8,0,0x20);
    if (ctx->predicated != 0) {
      pred_right = "(";
      pred._24_8_ = anon_var_dwarf_466c;
      make_D3D_srcarg_string_in_buf(ctx,&ctx->predicate_arg,local_d8,0x20);
    }
    snprintf(buf,buflen,"%s%s%s%s %s%s%s%s%s%s",sat_str,pcVar2,pcVar3,pcVar4,pred_right,local_d8,
             pred._24_8_,pcStack_90,&regtype_str,(long)&i + 2);
  }
  return buf;
}

Assistant:

static const char *make_D3D_destarg_string(Context *ctx, char *buf,
                                           const size_t buflen)
{
    const DestArgInfo *arg = &ctx->dest_arg;

    const char *result_shift_str = "";
    switch (arg->result_shift)
    {
        case 0x1: result_shift_str = "_x2"; break;
        case 0x2: result_shift_str = "_x4"; break;
        case 0x3: result_shift_str = "_x8"; break;
        case 0xD: result_shift_str = "_d8"; break;
        case 0xE: result_shift_str = "_d4"; break;
        case 0xF: result_shift_str = "_d2"; break;
    } // switch

    const char *sat_str = (arg->result_mod & MOD_SATURATE) ? "_sat" : "";
    const char *pp_str = (arg->result_mod & MOD_PP) ? "_pp" : "";
    const char *cent_str = (arg->result_mod & MOD_CENTROID) ? "_centroid" : "";

    char regnum_str[16];
    const char *regtype_str = get_D3D_register_string(ctx, arg->regtype,
                                                      arg->regnum, regnum_str,
                                                      sizeof (regnum_str));
    if (regtype_str == NULL)
    {
        fail(ctx, "Unknown destination register type.");
        *buf = '\0';
        return buf;
    } // if

    char writemask_str[6];
    size_t i = 0;
    const int scalar = isscalar(ctx, ctx->shader_type, arg->regtype, arg->regnum);
    if (!scalar && !writemask_xyzw(arg->writemask))
    {
        writemask_str[i++] = '.';
        if (arg->writemask0) writemask_str[i++] = 'x';
        if (arg->writemask1) writemask_str[i++] = 'y';
        if (arg->writemask2) writemask_str[i++] = 'z';
        if (arg->writemask3) writemask_str[i++] = 'w';
    } // if
    writemask_str[i] = '\0';
    assert(i < sizeof (writemask_str));

    const char *pred_left = "";
    const char *pred_right = "";
    char pred[32] = { '\0' };
    if (ctx->predicated)
    {
        pred_left = "(";
        pred_right = ") ";
        make_D3D_srcarg_string_in_buf(ctx, &ctx->predicate_arg,
                                      pred, sizeof (pred));
    } // if

    // may turn out something like "_x2_sat_pp_centroid (!p0.x) r0.xyzw" ...
    snprintf(buf, buflen, "%s%s%s%s %s%s%s%s%s%s",
             result_shift_str, sat_str, pp_str, cent_str,
             pred_left, pred, pred_right,
             regtype_str, regnum_str, writemask_str);
    // !!! FIXME: make sure the scratch buffer was large enough.
    return buf;
}